

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O2

void __thiscall Clasp::ClaspConfig::ClaspConfig(ClaspConfig *this)

{
  Impl *pIVar1;
  
  BasicSatConfig::BasicSatConfig(&this->super_BasicSatConfig);
  (this->super_BasicSatConfig).super_UserConfiguration.super_Configuration._vptr_Configuration =
       (_func_int **)&PTR__ClaspConfig_001e7270;
  SolveOptions::SolveOptions(&this->solve);
  this->asp = (AspOptions)0x500000000;
  (this->parse).set = '\0';
  this->tester_ = (UserConfig *)0x0;
  pIVar1 = (Impl *)operator_new(0x40);
  (pIVar1->mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (pIVar1->mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(pIVar1->mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(pIVar1->mutex).super___mutex_base._M_mutex + 0x10) = 0;
  pIVar1->acycSet = 0;
  (pIVar1->mutex).super___mutex_base._M_mutex.__align = 0;
  (pIVar1->pp).ebo_.buf = (pointer)0x0;
  (pIVar1->pp).ebo_.size = 0;
  (pIVar1->pp).ebo_.cap = 0;
  this->impl_ = pIVar1;
  return;
}

Assistant:

ClaspConfig::ClaspConfig() : tester_(0), impl_(new Impl()) {}